

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlunicode.c
# Opt level: O0

int xmlUCSIsCatZs(int code)

{
  undefined1 local_d;
  int code_local;
  
  local_d = true;
  if (((((code != 0x20) && (local_d = true, code != 0xa0)) && (local_d = true, code != 0x1680)) &&
      ((local_d = true, code != 0x180e && ((code < 0x2000 || (local_d = true, 0x200a < code)))))) &&
     ((local_d = true, code != 0x202f && (local_d = true, code != 0x205f)))) {
    local_d = code == 0x3000;
  }
  return (int)local_d;
}

Assistant:

int
xmlUCSIsCatZs(int code) {
    return((code == 0x20) ||
           (code == 0xa0) ||
           (code == 0x1680) ||
           (code == 0x180e) ||
           ((code >= 0x2000) && (code <= 0x200a)) ||
           (code == 0x202f) ||
           (code == 0x205f) ||
           (code == 0x3000));
}